

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

int uv_replace_allocator
              (uv_malloc_func malloc_func,uv_realloc_func realloc_func,uv_calloc_func calloc_func,
              uv_free_func free_func)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)(malloc_func == (uv_malloc_func)0x0);
  auVar2._4_4_ = -(uint)(realloc_func == (uv_realloc_func)0x0);
  auVar2._8_4_ = -(uint)(calloc_func == (uv_calloc_func)0x0);
  auVar2._12_4_ = -(uint)(free_func == (uv_free_func)0x0);
  iVar1 = movmskps(in_EAX,auVar2);
  if (iVar1 != 0) {
    return -0x16;
  }
  uv__allocator_0 = malloc_func;
  uv__allocator_1 = realloc_func;
  uv__allocator_2 = calloc_func;
  uv__allocator_3 = free_func;
  return 0;
}

Assistant:

int uv_replace_allocator(uv_malloc_func malloc_func,
                         uv_realloc_func realloc_func,
                         uv_calloc_func calloc_func,
                         uv_free_func free_func) {
  if (malloc_func == NULL || realloc_func == NULL ||
      calloc_func == NULL || free_func == NULL) {
    return UV_EINVAL;
  }

  uv__allocator.local_malloc = malloc_func;
  uv__allocator.local_realloc = realloc_func;
  uv__allocator.local_calloc = calloc_func;
  uv__allocator.local_free = free_func;

  return 0;
}